

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O1

QTextFrame * __thiscall QTextDocumentPrivate::frameAt(QTextDocumentPrivate *this,int pos)

{
  bool bVar1;
  int iVar2;
  QTextFrame *this_00;
  uint uVar3;
  int iVar4;
  int iVar5;
  QTextFrame *this_01;
  QTextFrame *pQVar6;
  long in_FS_OFFSET;
  QList<QTextFrame_*> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = rootFrame(this);
  do {
    this_01 = this_00;
    local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.ptr = (QTextFrame **)&DAT_aaaaaaaaaaaaaaaa;
    QTextFrame::childFrames(&local_58,this_01);
    iVar5 = (int)local_58.d.size + -1;
    iVar4 = 0;
    pQVar6 = this_01;
    do {
      if (iVar5 < iVar4) {
        this_00 = (QTextFrame *)0x0;
        break;
      }
      uVar3 = (uint)(iVar4 + iVar5) >> 1;
      this_00 = local_58.d.ptr[uVar3];
      iVar2 = QTextFrame::lastPosition(this_00);
      if (iVar2 < pos) {
        iVar4 = uVar3 + 1;
        bVar1 = true;
        this_00 = pQVar6;
      }
      else {
        iVar2 = QTextFrame::firstPosition(this_00);
        if (pos < iVar2) {
          iVar5 = uVar3 - 1;
          bVar1 = true;
          this_00 = pQVar6;
        }
        else {
          bVar1 = false;
        }
      }
      pQVar6 = this_00;
    } while (bVar1);
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,8,0x10);
      }
    }
    if (this_00 == (QTextFrame *)0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return this_01;
    }
  } while( true );
}

Assistant:

QTextFrame *QTextDocumentPrivate::frameAt(int pos) const
{
    QTextFrame *f = rootFrame();

    while (1) {
        QTextFrame *c = findChildFrame(f, pos);
        if (!c)
            return f;
        f = c;
    }
}